

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O0

Nwk_Obj_t * Nwk_ManCreateObj(Nwk_Man_t *p,int nFanins,int nFanouts)

{
  int iVar1;
  Nwk_Obj_t *__s;
  Nwk_Obj_t *pObj;
  int nFanouts_local;
  int nFanins_local;
  Nwk_Man_t *p_local;
  
  __s = (Nwk_Obj_t *)
        Aig_MmFlexEntryFetch(p->pMemObjs,(nFanins + nFanouts + p->nFanioPlus) * 8 + 0x50);
  memset(__s,0,0x50);
  __s->pFanio = (Nwk_Obj_t **)(__s + 1);
  iVar1 = Vec_PtrSize(p->vObjs);
  __s->Id = iVar1;
  Vec_PtrPush(p->vObjs,__s);
  __s->pMan = p;
  __s->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates an object.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Obj_t * Nwk_ManCreateObj( Nwk_Man_t * p, int nFanins, int nFanouts )
{
    Nwk_Obj_t * pObj;
    pObj = (Nwk_Obj_t *)Aig_MmFlexEntryFetch( p->pMemObjs, sizeof(Nwk_Obj_t) + (nFanins + nFanouts + p->nFanioPlus) * sizeof(Nwk_Obj_t *) );
    memset( pObj, 0, sizeof(Nwk_Obj_t) );
    pObj->pFanio = (Nwk_Obj_t **)((char *)pObj + sizeof(Nwk_Obj_t));
    pObj->Id = Vec_PtrSize( p->vObjs );
    Vec_PtrPush( p->vObjs, pObj );
    pObj->pMan        = p;
    pObj->nFanioAlloc = nFanins + nFanouts + p->nFanioPlus;
    return pObj;
}